

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_feb727::CTransactionSignatureSerializer<CTransaction>::
SerializeScriptCode<HashWriter>(CTransactionSignatureSerializer<CTransaction> *this,HashWriter *s)

{
  long lVar1;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  bool bVar2;
  const_iterator b;
  HashWriter *__n;
  const_iterator in_RSI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  uint nCodeSeparators;
  opcodetype opcode;
  const_iterator itBegin;
  const_iterator it;
  size_t in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  const_iterator *in_stack_ffffffffffffff40;
  HashWriter *in_stack_ffffffffffffff48;
  void *local_98;
  void *local_80;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff30.ptr);
  do {
    bVar2 = CScript::GetOp((CScript *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           (opcodetype *)in_stack_ffffffffffffff38.ptr);
  } while (bVar2);
  __n = (HashWriter *)in_RSI.ptr;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff38.ptr);
  WriteCompactSize<HashWriter>
            ((HashWriter *)in_stack_ffffffffffffff38.ptr,(uint64_t)in_stack_ffffffffffffff30.ptr);
  while (bVar2 = CScript::GetOp((CScript *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                (opcodetype *)in_stack_ffffffffffffff38.ptr), bVar2) {
    if (local_1c == 0xab) {
      in_stack_ffffffffffffff48 = (HashWriter *)in_RSI.ptr;
      in_stack_ffffffffffffff40 =
           (const_iterator *)
           prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator[]
                     ((const_iterator *)in_stack_ffffffffffffff38.ptr,
                      (size_type)((ulong)in_stack_ffffffffffffff30.ptr >> 0x20));
      ::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Span<const_unsigned_char>::Span<const_unsigned_char,_0>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffff38.ptr,
                 in_stack_ffffffffffffff30.ptr,in_stack_ffffffffffffff28);
      s_00.m_size = (size_t)in_stack_ffffffffffffff48;
      s_00.m_data = (uchar *)in_stack_ffffffffffffff40;
      SVar3 = AsBytes<unsigned_char_const>(s_00);
      local_80 = (void *)SVar3.m_size;
      HashWriter::write(in_stack_ffffffffffffff48,(int)SVar3.m_data,local_80,(size_t)__n);
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::end
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff30.ptr);
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator!=
                    ((const_iterator *)in_stack_ffffffffffffff30.ptr,in_stack_ffffffffffffff38);
  if (bVar2) {
    b.ptr = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator[]
                      (in_RSI.ptr,(size_type)((ulong)in_stack_ffffffffffffff30.ptr >> 0x20));
    ::operator-(in_RSI,b);
    Span<const_unsigned_char>::Span<const_unsigned_char,_0>
              ((Span<const_unsigned_char> *)in_RSI.ptr,b.ptr,in_stack_ffffffffffffff28);
    s_01.m_size = (size_t)in_stack_ffffffffffffff48;
    s_01.m_data = (uchar *)in_stack_ffffffffffffff40;
    SVar3 = AsBytes<unsigned_char_const>(s_01);
    local_98 = (void *)SVar3.m_size;
    HashWriter::write((HashWriter *)in_RSI.ptr,(int)SVar3.m_data,local_98,(size_t)__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeScriptCode(S &s) const {
        CScript::const_iterator it = scriptCode.begin();
        CScript::const_iterator itBegin = it;
        opcodetype opcode;
        unsigned int nCodeSeparators = 0;
        while (scriptCode.GetOp(it, opcode)) {
            if (opcode == OP_CODESEPARATOR)
                nCodeSeparators++;
        }
        ::WriteCompactSize(s, scriptCode.size() - nCodeSeparators);
        it = itBegin;
        while (scriptCode.GetOp(it, opcode)) {
            if (opcode == OP_CODESEPARATOR) {
                s.write(AsBytes(Span{&itBegin[0], size_t(it - itBegin - 1)}));
                itBegin = it;
            }
        }
        if (itBegin != scriptCode.end())
            s.write(AsBytes(Span{&itBegin[0], size_t(it - itBegin)}));
    }